

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_local_datetime<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  local_date lVar2;
  undefined4 uVar3;
  size_t sVar4;
  undefined8 uVar5;
  char_type_conflict cVar8;
  error_type *this;
  value_type *pvVar9;
  value_type *pvVar10;
  error_type *this_00;
  error_info *v;
  error_info *v_01;
  error_info *ctx_00;
  local_datetime_format_info fmt;
  local_datetime_type x;
  ulong uStackY_5e0;
  local_datetime val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5b8;
  string local_5a0;
  string local_580;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  time_fmt_reg;
  location first;
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  date_fmt_reg;
  region reg;
  source_location src;
  source_location local_2e0;
  region local_268;
  error_info local_200;
  error_info local_1a8;
  undefined1 local_150 [200];
  error_info local_88;
  undefined2 uVar6;
  undefined2 uVar7;
  basic_value<toml::type_config> *v_00;
  
  location::location(&first,loc);
  parse_local_date_only<toml::type_config>(&date_fmt_reg,loc,ctx);
  if (date_fmt_reg.is_ok_ == false) {
    this = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
           ::unwrap_err(&date_fmt_reg,(source_location)0x4db358);
    err<toml::error_info&>((failure<toml::error_info> *)&local_1a8,(toml *)this,v);
    ctx_00 = &local_1a8;
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_1a8);
    error_info::~error_info(&local_1a8);
  }
  else {
    cVar8 = location::current(loc);
    if (cVar8 == 'T') {
      uStackY_5e0 = 0;
    }
    else {
      cVar8 = location::current(loc);
      if (cVar8 == 't') {
        uStackY_5e0 = 1;
      }
      else {
        cVar8 = location::current(loc);
        if (cVar8 != ' ') {
          region::region((region *)&time_fmt_reg,loc);
          source_location::source_location(&src,(region *)&time_fmt_reg);
          region::~region((region *)&time_fmt_reg);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_580,
                     "toml::parse_local_datetime: expect date-time delimiter `T`, `t` or ` `(space)."
                     ,(allocator<char> *)&reg);
          source_location::source_location(&local_2e0,&src);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5a0,"here",(allocator<char> *)&val);
          make_error_info<>((error_info *)&time_fmt_reg,&local_580,&local_2e0,&local_5a0);
          err<toml::error_info>((failure<toml::error_info> *)&local_88,(error_info *)&time_fmt_reg);
          ctx_00 = &local_88;
          result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                    (__return_storage_ptr__,(failure_type *)&local_88);
          error_info::~error_info(&local_88);
          error_info::~error_info((error_info *)&time_fmt_reg);
          std::__cxx11::string::~string((string *)&local_5a0);
          source_location::~source_location(&local_2e0);
          std::__cxx11::string::~string((string *)&local_580);
          source_location::~source_location(&src);
          goto LAB_0032e2f1;
        }
        uStackY_5e0 = 2;
      }
    }
    location::advance(loc,1);
    parse_local_time_only<toml::type_config>(&time_fmt_reg,loc,ctx);
    if (time_fmt_reg.is_ok_ == false) {
      this_00 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                ::unwrap_err(&time_fmt_reg,(source_location)0x4db370);
      err<toml::error_info&>((failure<toml::error_info> *)&local_200,(toml *)this_00,v_01);
      ctx_00 = &local_200;
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (__return_storage_ptr__,(failure_type *)&local_200);
      error_info::~error_info(&local_200);
    }
    else {
      pvVar9 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
               ::unwrap(&time_fmt_reg,(source_location)0x4db388);
      bVar1 = (pvVar9->
              super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
              ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
              super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.has_seconds;
      pvVar9 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
               ::unwrap(&time_fmt_reg,(source_location)0x4db3a0);
      sVar4 = (pvVar9->
              super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
              ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
              super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.
              subsecond_precision;
      region::region(&reg,&first,loc);
      pvVar10 = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                ::unwrap(&date_fmt_reg,(source_location)0x4db3b8);
      lVar2 = (pvVar10->
              super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
              ).super__Head_base<0UL,_toml::local_date,_false>._M_head_impl;
      pvVar9 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
               ::unwrap(&time_fmt_reg,(source_location)0x4db3d0);
      uStackY_5e0 = (ulong)bVar1 << 8 | uStackY_5e0;
      uVar5._0_1_ = (pvVar9->
                    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                    ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.hour;
      uVar5._1_1_ = (pvVar9->
                    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                    ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.minute;
      uVar5._2_1_ = (pvVar9->
                    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                    ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.second;
      uVar5._3_1_ = (pvVar9->
                    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                    ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.field_0x3;
      uVar6 = (pvVar9->
              super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
              ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.millisecond;
      uVar7 = (pvVar9->
              super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
              ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.microsecond;
      uVar5._4_4_ = CONCAT22(uVar7,uVar6);
      uVar3 = *(undefined4 *)
               &(pvVar9->
                super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.nanosecond;
      val.time._0_4_ = SUB84(uVar5,0);
      val.time.nanosecond = (uint16_t)uVar3;
      x.time.hour = val.time.hour;
      x.time.minute = val.time.minute;
      x.time.second = val.time.second;
      x.time._3_1_ = val.time._3_1_;
      x.date = lVar2;
      local_5b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_5b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_5b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      val.date = lVar2;
      val.time._4_4_ = uVar5._4_4_;
      region::region(&local_268,&reg);
      fmt.subsecond_precision = sVar4;
      fmt.delimiter = (char)uStackY_5e0;
      fmt.has_seconds = (bool)(char)(uStackY_5e0 >> 8);
      fmt._2_6_ = (int6)(uStackY_5e0 >> 0x10);
      x.time._4_6_ = (undefined6)CONCAT44(uVar3,uVar5._4_4_);
      basic_value<toml::type_config>::basic_value
                ((basic_value<toml::type_config> *)&src,x,fmt,&local_5b8,&local_268);
      ok<toml::basic_value<toml::type_config>>
                ((success<toml::basic_value<toml::type_config>_> *)local_150,(toml *)&src,v_00);
      ctx_00 = (error_info *)local_150;
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (__return_storage_ptr__,(success_type *)ctx_00);
      basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_150);
      basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)&src);
      region::~region(&local_268);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_5b8);
      region::~region(&reg);
    }
    result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
    ::cleanup(&time_fmt_reg,(EVP_PKEY_CTX *)ctx_00);
  }
LAB_0032e2f1:
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  ::cleanup(&date_fmt_reg,(EVP_PKEY_CTX *)ctx_00);
  location::~location(&first);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_local_datetime(location& loc, const context<TC>& ctx)
{
    using char_type = location::char_type;

    const auto first = loc;

    local_datetime_format_info fmt;

    // ----------------------------------------------------------------------

    auto date_fmt_reg = parse_local_date_only(loc, ctx);
    if(date_fmt_reg.is_err())
    {
        return err(date_fmt_reg.unwrap_err());
    }

    if(loc.current() == char_type('T'))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::upper_T;
    }
    else if(loc.current() == char_type('t'))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::lower_t;
    }
    else if(loc.current() == char_type(' '))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::space;
    }
    else
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_local_datetime: "
            "expect date-time delimiter `T`, `t` or ` `(space).",
            std::move(src), "here"));
    }

    auto time_fmt_reg = parse_local_time_only(loc, ctx);
    if(time_fmt_reg.is_err())
    {
        return err(time_fmt_reg.unwrap_err());
    }

    fmt.has_seconds         = std::get<1>(time_fmt_reg.unwrap()).has_seconds;
    fmt.subsecond_precision = std::get<1>(time_fmt_reg.unwrap()).subsecond_precision;

    // ----------------------------------------------------------------------

    region reg(first, loc);
    local_datetime val(std::get<0>(date_fmt_reg.unwrap()),
                       std::get<0>(time_fmt_reg.unwrap()));

    return ok(basic_value<TC>(val, std::move(fmt), {}, std::move(reg)));
}